

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O1

void __thiscall NaPNSwapper::post_action(NaPNSwapper *this)

{
  bool bVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  NaPetriCnInput *this_00;
  
  pNVar3 = NaPetriCnInput::data(&this->turn);
  iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  if (*(double *)CONCAT44(extraout_var,iVar2) <= 0.0) {
    bVar1 = NaPetriCnInput::is_waiting(&this->in2);
    if (!bVar1) {
      bVar1 = NaPetriCnOutput::is_waiting(&this->out);
      if (!bVar1) {
        NaPetriCnOutput::commit_data(&this->out);
        NaPetriCnInput::commit_data(&this->in2);
      }
    }
    this_00 = &this->in;
  }
  else {
    bVar1 = NaPetriCnInput::is_waiting(&this->in);
    if (!bVar1) {
      bVar1 = NaPetriCnOutput::is_waiting(&this->out);
      if (!bVar1) {
        NaPetriCnOutput::commit_data(&this->out);
        NaPetriCnInput::commit_data(&this->in);
      }
    }
    this_00 = &this->in2;
  }
  bVar1 = NaPetriCnInput::is_waiting(this_00);
  if (!bVar1) {
    bVar1 = NaPetriCnOutput::is_waiting(&this->out2);
    if (!bVar1) {
      NaPetriCnOutput::commit_data(&this->out2);
      NaPetriCnInput::commit_data(this_00);
    }
  }
  NaPetriCnInput::commit_data(&this->turn);
  return;
}

Assistant:

void
NaPNSwapper::post_action ()
{
    if(turn.data()[0] > 0){
        // Copy input to output
        if(!in.is_waiting() && !out.is_waiting()){
            out.commit_data();
            in.commit_data();
        }
        if(!in2.is_waiting() && !out2.is_waiting()){
            out2.commit_data();
            in2.commit_data();
        }
    }else{
        // Copy crossed input to output
        if(!in2.is_waiting() && !out.is_waiting()){
            out.commit_data();
            in2.commit_data();
        }
        if(!in.is_waiting() && !out2.is_waiting()){
            out2.commit_data();
            in.commit_data();
        }
    }
    turn.commit_data();
}